

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O1

uint * Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *pObj,Vec_Int_t *vTruth,int nWords)

{
  Hop_Obj_t *pHVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                  ,0x65,"unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 0x14) {
    return (uint *)(pObj->field_0).pData;
  }
  puVar3 = Hop_ManConvertAigToTruth_rec2
                     ((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vTruth,nWords);
  puVar4 = Hop_ManConvertAigToTruth_rec2
                     ((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vTruth,nWords);
  if (nWords == 0) {
LAB_007e4a08:
    puVar6 = (uint *)0x0;
  }
  else {
    if (nWords < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar5 = (long)nWords + (long)vTruth->nSize;
    iVar2 = (int)lVar5;
    vTruth->nSize = iVar2;
    if (vTruth->nCap < iVar2) goto LAB_007e4a08;
    puVar6 = (uint *)(vTruth->pArray + (lVar5 - (ulong)(uint)nWords));
  }
  if ((*(uint *)&pObj->field_0x20 & 7) == 5) {
    if (0 < nWords) {
      uVar7 = 0;
      do {
        puVar6[uVar7] = puVar4[uVar7] ^ puVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
    goto LAB_007e4acb;
  }
  pHVar1 = pObj->pFanin0;
  if (((ulong)pHVar1 & 1) == 0) {
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      if (0 < nWords) {
        uVar7 = 0;
        do {
          puVar6[uVar7] = puVar4[uVar7] & puVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
      goto LAB_007e4acb;
    }
    if (((ulong)pHVar1 & 1) != 0) goto LAB_007e4a8b;
    if (((ulong)pObj->pFanin1 & 1) != 0) {
      if (0 < nWords) {
        uVar7 = 0;
        do {
          puVar6[uVar7] = ~puVar4[uVar7] & puVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
      goto LAB_007e4acb;
    }
    if (((ulong)pHVar1 & 1) != 0) goto LAB_007e4a8b;
  }
  else {
LAB_007e4a8b:
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      if (0 < nWords) {
        uVar7 = 0;
        do {
          puVar6[uVar7] = ~puVar3[uVar7] & puVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
      goto LAB_007e4acb;
    }
  }
  if (0 < nWords) {
    uVar7 = 0;
    do {
      puVar6[uVar7] = ~(puVar4[uVar7] | puVar3[uVar7]);
      uVar7 = uVar7 + 1;
    } while ((uint)nWords != uVar7);
  }
LAB_007e4acb:
  if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef;
    (pObj->field_0).pData = puVar6;
    return puVar6;
  }
  __assert_fail("Hop_ObjIsMarkA(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                ,0x7c,"unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)");
}

Assistant:

unsigned * Hop_ManConvertAigToTruth_rec2( Hop_Obj_t * pObj, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return (unsigned *)pObj->pData;
    // compute the truth tables of the fanins
    pTruth0 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin0(pObj), vTruth, nWords );
    pTruth1 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin1(pObj), vTruth, nWords );
    // creat the truth table of the node
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( Hop_ObjIsExor(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
    pObj->pData = pTruth;
    return pTruth;
}